

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_resume(lua_State *L,int nargs)

{
  undefined4 *puVar1;
  long lVar2;
  GCstr *pGVar3;
  ulong uVar4;
  int in_ESI;
  long in_RDI;
  ErrMsg in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  int local_6c;
  
  if ((*(long *)(in_RDI + 0x30) == 0) && (*(byte *)(in_RDI + 7) < 2)) {
    if (*(char *)(in_RDI + 7) == '\0') {
      lVar2 = *(long *)(in_RDI + 0x18) + (long)in_ESI * -8;
    }
    else {
      lVar2 = *(long *)(in_RDI + 0x18) + (long)in_ESI * -8;
    }
    local_6c = lj_vm_resume(in_RDI,lVar2,0,0);
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
    puVar1 = *(undefined4 **)(in_RDI + 0x18);
    pGVar3 = lj_err_str(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    *puVar1 = (int)pGVar3;
    puVar1[1] = 0xfffffffb;
    uVar4 = *(long *)(in_RDI + 0x18) + 8;
    *(ulong *)(in_RDI + 0x18) = uVar4;
    if (*(uint *)(in_RDI + 0x20) <= uVar4) {
      lj_state_growstack1((lua_State *)0x11062b);
    }
    local_6c = 2;
  }
  return local_6c;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L,
      L->status == LUA_OK ? api_call_base(L, nargs) : L->top - nargs,
      0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}